

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::LocalClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,LocalClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  WirePointer **params_4;
  Builder builder;
  ushort uVar1;
  uint64_t uVar2;
  ClientHook *pCVar3;
  LocalRequest *pLVar4;
  MallocMessageBuilder *this_00;
  Own<capnp::LocalRequest,_std::nullptr_t> *other;
  Own<capnp::RequestHook,_std::nullptr_t> local_d8;
  SegmentBuilder *local_c8;
  SegmentBuilder *pSStack_c0;
  WirePointer *local_b8;
  undefined1 auStack_b0 [8];
  Builder root;
  undefined1 local_88 [8];
  Own<capnp::LocalRequest,_std::nullptr_t> hook;
  Maybe<capnp::MessageSize> local_60;
  Own<capnp::ClientHook,_std::nullptr_t> *local_48;
  Own<capnp::ClientHook,_std::nullptr_t> *r;
  Own<capnp::ClientHook,_std::nullptr_t> *_r573;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_28;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  LocalClient *this_local;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *pRStack_10;
  CallHints hints_local;
  
  _r573 = (Own<capnp::ClientHook,_std::nullptr_t> *)sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_28 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local._6_2_ = hints;
  pRStack_10 = __return_storage_ptr__;
  local_48 = kj::_::readMaybe<capnp::ClientHook,decltype(nullptr)>(&this->resolved);
  r = local_48;
  if (local_48 == (Own<capnp::ClientHook,_std::nullptr_t> *)0x0) {
    params_4 = &root.builder.pointer;
    kj::addRef<capnp::LocalClient>((kj *)params_4,this);
    kj::
    heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,capnp::Capability::Client::CallHints&,kj::Own<capnp::LocalClient,decltype(nullptr)>>
              ((kj *)local_88,&stack0xffffffffffffffd8,(unsigned_short *)((long)&sizeHint_local + 6)
               ,sizeHint,(CallHints *)((long)&this_local + 6),
               (Own<capnp::LocalClient,_std::nullptr_t> *)params_4);
    kj::Own<capnp::LocalClient,_std::nullptr_t>::~Own
              ((Own<capnp::LocalClient,_std::nullptr_t> *)&root.builder.pointer);
    pLVar4 = kj::Own<capnp::LocalRequest,_std::nullptr_t>::operator->
                       ((Own<capnp::LocalRequest,_std::nullptr_t> *)local_88);
    this_00 = kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::operator->(&pLVar4->message);
    MessageBuilder::getRoot<capnp::AnyPointer>((Builder *)auStack_b0,&this_00->super_MessageBuilder)
    ;
    local_b8 = (WirePointer *)root.builder.capTable;
    local_c8 = (SegmentBuilder *)auStack_b0;
    pSStack_c0 = root.builder.segment;
    other = kj::mv<kj::Own<capnp::LocalRequest,decltype(nullptr)>>
                      ((Own<capnp::LocalRequest,_std::nullptr_t> *)local_88);
    kj::Own<capnp::RequestHook,decltype(nullptr)>::Own<capnp::LocalRequest,void>
              ((Own<capnp::RequestHook,decltype(nullptr)> *)&local_d8,other);
    builder.builder.capTable = (CapTableBuilder *)pSStack_c0;
    builder.builder.segment = local_c8;
    builder.builder.pointer = local_b8;
    Request<capnp::AnyPointer,_capnp::AnyPointer>::Request(__return_storage_ptr__,builder,&local_d8)
    ;
    kj::Own<capnp::RequestHook,_std::nullptr_t>::~Own(&local_d8);
    kj::Own<capnp::LocalRequest,_std::nullptr_t>::~Own
              ((Own<capnp::LocalRequest,_std::nullptr_t> *)local_88);
  }
  else {
    pCVar3 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(local_48);
    uVar2 = uStack_28;
    uVar1 = sizeHint_local._6_2_;
    kj::Maybe<capnp::MessageSize>::Maybe(&local_60,sizeHint);
    (**pCVar3->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar3,uVar2,(ulong)uVar1,&local_60,
               (ulong)(ushort)this_local._6_2_);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      // We resolved to a shortened path. New calls MUST go directly to the replacement capability
      // so that their ordering is consistent with callers who call getResolved() to get direct
      // access to the new capability. In particular it's important that we don't place these calls
      // in our streaming queue.
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, hints, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }